

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_average_down_boundaries(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  DistributionMapping *this;
  double dVar1;
  uint ncomp;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  int iVar7;
  FabArray<amrex::FArrayBox> *fine_00;
  bool bVar8;
  FabType FVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  FabArray<amrex::EBCellFlagFab> *pFVar13;
  MultiCutFab *this_00;
  int *piVar14;
  ulong uVar15;
  Periodicity *period;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  void *__s;
  long lVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  int local_3b0;
  long local_388;
  int local_364;
  ulong local_360;
  Box local_344;
  ulong local_328;
  ulong local_320;
  long local_318;
  long local_310;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  FabArray<amrex::FArrayBox> *local_2f0;
  ulong local_2e8;
  long local_2e0;
  Box result;
  undefined4 uStack_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined1 local_248 [24];
  pointer pbStack_230;
  undefined8 local_228;
  int local_220;
  Array4<const_double> local_208;
  MFItInfo info;
  MFIter mfi;
  
  ncomp = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  pFVar6 = (fine->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar6 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar12 = __dynamic_cast(pFVar6,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar12 == 0)) {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = ngcrse;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = ngcrse;
    mfi.fabArray._0_4_ = ngcrse;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&crse->super_FabArray<amrex::FArrayBox>,0.0,0,ncomp,(IntVect *)&mfi);
  }
  else {
    iVar2 = ratio->vect[0];
    iVar3 = ratio->vect[1];
    iVar4 = ratio->vect[2];
    local_2f0 = &fine->super_FabArray<amrex::FArrayBox>;
    lVar12 = __dynamic_cast(pFVar6,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar12 == 0) {
      __cxa_bad_cast();
    }
    pFVar13 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar12 + 0xd8));
    this_00 = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar12 + 0xd8));
    fine_00 = local_2f0;
    this = &(((FabArray<amrex::FArrayBox> *)&local_2f0->super_FabArrayBase)->super_FabArrayBase).
            distributionMap;
    bVar8 = DistributionMapping::operator==
                      (this,&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                             distributionMap);
    if ((bVar8) &&
       ((((FabArray<amrex::FArrayBox> *)&fine_00->super_FabArrayBase)->super_FabArrayBase).boxarray.
        m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      info.num_streams = Gpu::Device::max_gpu_streams;
      info.do_tiling = true;
      info.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
      info.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
      info.tilesize.vect[2] = DAT_00753ec0;
      info.dynamic = true;
      info.device_sync = true;
      MFIter::MFIter(&mfi,(FabArrayBase *)crse,&info);
      iVar5 = ngcrse;
      if (mfi.currentIndex < mfi.endIndex) {
        do {
          local_304 = iVar5;
          MFIter::growntilebox(&local_344,&mfi,local_304);
          piVar14 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar14 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          result.smallend.vect[1] = local_344.smallend.vect[1];
          result.smallend.vect[0] = local_344.smallend.vect[0];
          result.bigend.vect[1] = local_344.bigend.vect[1];
          result.bigend.vect[2] = local_344.bigend.vect[2];
          result.btype.itype = local_344.btype.itype;
          result.smallend.vect[2] = local_344.smallend.vect[2];
          result.bigend.vect[0] = local_344.bigend.vect[0];
          iVar5 = ratio->vect[0];
          iVar20 = ratio->vect[1];
          if (((iVar5 != 1) || (iVar20 != 1)) || (ratio->vect[2] != 1)) {
            result.smallend.vect[1] = local_344.smallend.vect[1] * iVar20;
            result.smallend.vect[0] = local_344.smallend.vect[0] * iVar5;
            result.smallend.vect[2] = local_344.smallend.vect[2] * ratio->vect[2];
            uVar10 = (uint)((local_344.btype.itype & 2) == 0);
            uVar23 = (uint)((local_344.btype.itype & 4) == 0);
            result.bigend.vect[0] =
                 (local_344.bigend.vect[0] + (~local_344.btype.itype & 1)) * iVar5 -
                 (~local_344.btype.itype & 1);
            result.bigend.vect[1] = (local_344.bigend.vect[1] + uVar10) * iVar20 - uVar10;
            result.bigend.vect[2] = (local_344.bigend.vect[2] + uVar23) * ratio->vect[2] - uVar23;
          }
          FVar9 = EBCellFlagFab::getType
                            ((pFVar13->m_fabs_v).
                             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar14],&result);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&result,&crse->super_FabArray<amrex::FArrayBox>,&mfi);
          iVar17 = local_344.bigend.vect[2];
          iVar16 = local_344.bigend.vect[1];
          iVar21 = local_344.bigend.vect[0];
          iVar11 = local_344.smallend.vect[2];
          iVar20 = local_344.smallend.vect[1];
          iVar5 = local_344.smallend.vect[0];
          if ((uint)(FVar9 + singlevalued) < 2) {
            if (0 < (int)ncomp) {
              lVar12 = (long)local_344.smallend.vect[1];
              local_310 = (long)local_344.smallend.vect[0] << 3;
              uVar10 = local_344.bigend.vect[0] - local_344.smallend.vect[0];
              local_318 = CONCAT44(local_318._4_4_,
                                   (local_344.bigend.vect[1] - local_344.smallend.vect[1]) + 1);
              local_388 = 0;
              uVar15 = 0;
              do {
                local_320 = uVar15;
                iVar7 = iVar11;
                if (iVar11 <= iVar17) {
                  do {
                    if (iVar20 <= iVar16) {
                      lVar18 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                      __s = (void *)(CONCAT44(uStack_2bc,result.btype.itype) * local_388 +
                                     (lVar12 - (int)local_2b4) * lVar18 +
                                     (long)(iVar7 - local_2b0) *
                                     CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                     (long)(int)local_2b8 * -8 +
                                    result.smallend.vect._0_8_ + local_310);
                      iVar27 = (int)local_318;
                      do {
                        if (iVar5 <= iVar21) {
                          memset(__s,0,(ulong)uVar10 * 8 + 8);
                        }
                        __s = (void *)((long)__s + lVar18);
                        iVar27 = iVar27 + -1;
                      } while (iVar27 != 0);
                    }
                    bVar8 = iVar7 != iVar17;
                    iVar7 = iVar7 + 1;
                  } while (bVar8);
                }
                uVar15 = local_320 + 1;
                local_388 = local_388 + 8;
              } while (uVar15 != ncomp);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_248,local_2f0,&mfi);
            MultiCutFab::const_array(&local_208,this_00,&mfi);
            local_2f8 = local_344.bigend.vect[2];
            if (local_344.smallend.vect[2] <= local_344.bigend.vect[2]) {
              local_2e8 = (ulong)(uint)local_344.smallend.vect[1];
              local_2f4 = iVar2 * local_344.smallend.vect[0];
              local_2fc = iVar3 * local_344.smallend.vect[1];
              local_300 = (local_344.smallend.vect[1] + 1U) * iVar3;
              iVar20 = iVar4 * local_344.smallend.vect[2];
              local_3b0 = (local_344.smallend.vect[2] + 1) * iVar4;
              iVar5 = local_344.smallend.vect[2];
              do {
                local_2e0 = (long)iVar20;
                if (local_344.smallend.vect[1] <= local_344.bigend.vect[1]) {
                  local_320 = CONCAT44(local_320._4_4_,iVar5 * iVar4);
                  iVar11 = local_300;
                  iVar21 = local_2fc;
                  local_360 = local_2e8;
                  do {
                    lVar12 = (long)iVar21;
                    iVar16 = (int)local_360;
                    if (local_344.smallend.vect[0] <= local_344.bigend.vect[0]) {
                      local_328 = (ulong)(uint)local_344.smallend.vect[0];
                      local_364 = local_2f4;
                      do {
                        iVar17 = (int)local_328;
                        if (0 < (int)ncomp) {
                          local_310 = CONCAT44(uStack_2bc,result.btype.itype);
                          local_318 = ((long)iVar16 - (long)(int)local_2b4) *
                                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                      result.smallend.vect._0_8_ +
                                      ((long)iVar17 - (long)(int)local_2b8) * 8 +
                                      ((long)iVar5 - (long)(int)local_2b0) *
                                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          local_388 = 0;
                          uVar15 = 0;
                          do {
                            dVar30 = 0.0;
                            dVar32 = 0.0;
                            dVar31 = 0.0;
                            if (iVar5 * iVar4 < (iVar5 + 1) * iVar4) {
                              lVar26 = CONCAT44(local_208.jstride._4_4_,(int)local_208.jstride) * 8;
                              lVar29 = (long)local_208.p +
                                       (lVar12 - local_208.begin.y) * lVar26 +
                                       (local_2e0 - local_208.begin.z) * local_208.kstride * 8 +
                                       (long)local_208.begin.x * -8 + (long)local_364 * 8;
                              lVar28 = local_248._0_8_ +
                                       (long)pbStack_230 * local_388 +
                                       (lVar12 - local_228._4_4_) * local_248._8_8_ * 8 +
                                       (local_2e0 - local_220) * local_248._16_8_ * 8 +
                                       (long)(int)local_228 * -8 + (long)local_364 * 8;
                              lVar18 = local_2e0;
                              do {
                                lVar19 = lVar28;
                                lVar22 = lVar29;
                                lVar25 = lVar12;
                                if (iVar16 * iVar3 < (iVar16 + 1) * iVar3) {
                                  do {
                                    if (iVar17 * iVar2 < (iVar17 + 1) * iVar2) {
                                      lVar24 = 0;
                                      do {
                                        dVar1 = *(double *)(lVar22 + lVar24 * 8);
                                        dVar32 = dVar32 + *(double *)(lVar19 + lVar24 * 8) * dVar1;
                                        dVar31 = dVar31 + dVar1;
                                        lVar24 = lVar24 + 1;
                                      } while (iVar2 != (int)lVar24);
                                    }
                                    lVar25 = lVar25 + 1;
                                    lVar22 = lVar22 + lVar26;
                                    lVar19 = lVar19 + local_248._8_8_ * 8;
                                  } while (iVar11 != (int)lVar25);
                                }
                                lVar18 = lVar18 + 1;
                                lVar29 = lVar29 + local_208.kstride * 8;
                                lVar28 = lVar28 + local_248._16_8_ * 8;
                              } while (local_3b0 != (int)lVar18);
                            }
                            if (1e-30 < dVar31) {
                              dVar30 = dVar32 / dVar31;
                            }
                            *(double *)(local_318 + local_310 * uVar15 * 8) = dVar30;
                            uVar15 = uVar15 + 1;
                            local_388 = local_388 + 8;
                          } while (uVar15 != ncomp);
                        }
                        local_328 = (ulong)(iVar17 + 1);
                        local_364 = local_364 + iVar2;
                      } while (iVar17 != local_344.bigend.vect[0]);
                    }
                    local_360 = (ulong)(iVar16 + 1);
                    iVar21 = iVar21 + iVar3;
                    iVar11 = iVar11 + iVar3;
                  } while (iVar16 != local_344.bigend.vect[1]);
                }
                iVar20 = iVar20 + iVar4;
                local_3b0 = local_3b0 + iVar4;
                bVar8 = iVar5 != local_344.bigend.vect[2];
                iVar5 = iVar5 + 1;
              } while (bVar8);
            }
          }
          MFIter::operator++(&mfi);
          iVar5 = local_304;
        } while (mfi.currentIndex < mfi.endIndex);
      }
      MFIter::~MFIter(&mfi);
    }
    else {
      BoxArray::BoxArray((BoxArray *)&result,
                         &(((FabArray<amrex::FArrayBox> *)&fine_00->super_FabArrayBase)->
                          super_FabArrayBase).boxarray);
      BoxArray::coarsen((BoxArray *)&result,ratio);
      local_248._0_8_ = (double *)0x1;
      local_248._8_8_ = (Arena *)0x0;
      local_248._16_8_ = (pointer)0x0;
      pbStack_230 = (pointer)0x0;
      local_228 = (pointer)0x0;
      local_208.p = (double *)&PTR__FabFactory_0074e8d0;
      MultiFab::MultiFab((MultiFab *)&mfi,(BoxArray *)&result,this,ncomp,ngcrse,(MFInfo *)local_248,
                         (FabFactory<amrex::FArrayBox> *)&local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_248 + 0x10));
      EB_average_down_boundaries((MultiFab *)fine_00,(MultiFab *)&mfi,ratio,ngcrse);
      period = Periodicity::NonPeriodic();
      local_248._4_4_ = ngcrse;
      local_248._0_4_ = ngcrse;
      local_248._8_4_ = ngcrse;
      local_208.p = (double *)CONCAT44(ngcrse,ngcrse);
      local_208.jstride._0_4_ = ngcrse;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,
                 ncomp,(IntVect *)local_248,(IntVect *)&local_208,period,COPY,(CPC *)0x0,false);
      MultiFab::~MultiFab((MultiFab *)&mfi);
      BoxArray::~BoxArray((BoxArray *)&result);
    }
  }
  return;
}

Assistant:

void EB_average_down_boundaries (const MultiFab& fine, MultiFab& crse,
                                 const IntVect& ratio, int ngcrse)
{
    int ncomp = crse.nComp();

    if (!fine.hasEBFabFactory())
    {
        crse.setVal(0.0, 0, ncomp, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fine.Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& barea = factory.getBndryArea();

        if (isMFIterSafe(fine, crse))
        {
            MFItInfo info;
            if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse, info); mfi.isValid(); ++mfi)
            {
                const Box& tbx = mfi.growntilebox(ngcrse);
                FabType typ = flags[mfi].getType(amrex::refine(tbx,ratio));
                Array4<Real> const& ca = crse.array(mfi);
                if (FabType::covered == typ || FabType::regular == typ) {
                    AMREX_HOST_DEVICE_FOR_4D(tbx,ncomp,i,j,k,n,
                    {
                        ca(i,j,k,n) = 0.0;
                    });
                } else {
                    Array4<Real const> const& fa = fine.const_array(mfi);
                    Array4<Real const> const& ba = barea.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                    {
                        eb_avgdown_boundaries(i,j,k,fa,0,ca,0,ba,dratio,ncomp);
                    });
                }
            }
        }
        else
        {
            BoxArray cba = fine.boxArray();
            cba.coarsen(ratio);
            MultiFab ctmp(cba, fine.DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            EB_average_down_boundaries(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp, 0, 0, ncomp, ngcrse, ngcrse);
        }
    }
}